

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O1

int gotofile(char *fpth)

{
  line *plVar1;
  mgwin *pmVar2;
  int iVar3;
  line *dotp;
  char *__s2;
  int iVar4;
  int iVar5;
  bool bVar6;
  char local_438 [8];
  char fname [1024];
  int start;
  
  xbasename(local_438,fpth,0x400);
  plVar1 = curbp->b_headp;
  dotp = plVar1->l_fp;
  if (dotp == plVar1) {
    iVar5 = 0;
  }
  else {
    iVar4 = 0;
    do {
      d_warpdot(dotp,(int *)(fname + 0x3fc));
      if ((long)(int)fname._1020_4_ < 1) {
        __s2 = (char *)0x0;
      }
      else {
        __s2 = dotp->l_text + (int)fname._1020_4_;
      }
      iVar5 = iVar4 + 1;
      if ((__s2 != (char *)0x0) && (iVar3 = strcmp(local_438,__s2), pmVar2 = curwp, iVar3 == 0)) {
        curwp->w_dotp = dotp;
        pmVar2->w_dotline = iVar5;
        d_warpdot(dotp,&pmVar2->w_doto);
        iVar5 = iVar4;
        break;
      }
      dotp = dotp->l_fp;
      iVar4 = iVar5;
    } while (dotp != plVar1);
  }
  bVar6 = iVar5 != curbp->b_lines + -1;
  if (bVar6) {
    eerase();
  }
  else {
    ewprintf("File not found %s",local_438);
  }
  return (uint)bVar6;
}

Assistant:

int
gotofile(char *fpth)
{
	struct line	*lp, *nlp;
	char		 fname[NFILEN];
	char		*p;
	int		 tmp;

	(void)xbasename(fname, fpth, NFILEN);
	tmp = 0;
	for (lp = bfirstlp(curbp); lp != curbp->b_headp; lp = nlp) {
		tmp++;
		if ((p = findfname(lp, p)) == NULL) {
			nlp = lforw(lp);
			continue;
		}
		if (strcmp(fname, p) == 0) {
			curwp->w_dotp = lp;
			curwp->w_dotline = tmp;
			(void)d_warpdot(curwp->w_dotp, &curwp->w_doto);
			tmp--;
			break;
		}
		nlp = lforw(lp);
	}
	if (tmp == curbp->b_lines - 1) {
		ewprintf("File not found %s", fname);
		return (FALSE);
	} else {
		eerase();
		return (TRUE);
	}
}